

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O0

vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *
Rotate_BSpline(Vector3f *o,vector<Vector2f,_std::allocator<Vector2f>_> *controls,Material *m,int K)

{
  initializer_list<Vector2f> __l;
  initializer_list<Vector2f> __l_00;
  size_type sVar1;
  void *pvVar2;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_RDX;
  vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *in_RDI;
  int in_R8D;
  float x_00;
  double dVar3;
  vector<Vector2f,_std::allocator<Vector2f>_> *a;
  Rotate_BSpline_Segment *s;
  Rotate_BSpline_Segment *s_p;
  anon_class_1_0_00000001 gy;
  anon_class_1_0_00000001 gx;
  int j_3;
  vector<Vector2f,_std::allocator<Vector2f>_> v;
  int j_2;
  int j_1;
  int x;
  vector<Vector2f,_std::allocator<Vector2f>_> t;
  int j;
  float r;
  float l;
  int g;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  f;
  anon_class_16_2_94731ba6 tt;
  int N;
  vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *output;
  Vector3f *in_stack_fffffffffffffb58;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffb60;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffb68;
  allocator_type *in_stack_fffffffffffffb70;
  Vector2f *in_stack_fffffffffffffb78;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  *in_stack_fffffffffffffb80;
  allocator_type *in_stack_fffffffffffffb88;
  Rotate_BSpline_Segment *in_stack_fffffffffffffb90;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba4;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffba8;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffbb0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbd0;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffbf0;
  vector<Vector2f,_std::allocator<Vector2f>_> *in_stack_fffffffffffffbf8;
  vector<Vector2f,_std::allocator<Vector2f>_> local_3b0 [2];
  vector<Vector2f,_std::allocator<Vector2f>_> local_380;
  allocator_type local_368 [24];
  Vector2f local_350 [3];
  void *local_338;
  void *local_330;
  int local_2b4;
  undefined1 local_291 [25];
  undefined8 local_278;
  Vector2f local_208;
  Vector2f local_200;
  Vector2f *local_1f8;
  undefined8 local_1f0;
  int local_16c;
  int local_a0;
  int local_9c;
  Vector2f local_80;
  int local_78;
  float local_74;
  float local_70;
  int local_6c;
  undefined1 local_65;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  local_50;
  anon_class_16_2_94731ba6 local_38;
  int local_28;
  int local_24 [9];
  
  local_24[0] = in_R8D;
  sVar1 = std::vector<Vector2f,_std::allocator<Vector2f>_>::size(in_RDX);
  local_28 = (int)sVar1 + -1;
  local_38.N = &local_28;
  local_38.K = local_24;
  std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>::allocator
            ((allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_> *)0x280590);
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::vector(in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70)
  ;
  std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>::~allocator
            ((allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_> *)0x2805bc);
  local_65 = 0;
  std::vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>::vector
            ((vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *)0x2805d1
            );
  for (local_6c = local_24[0]; local_6c <= local_28; local_6c = local_6c + 1) {
    dVar3 = Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_6c);
    local_70 = (float)dVar3;
    dVar3 = Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_6c + 1);
    local_74 = (float)dVar3;
    for (local_78 = 0; local_78 < local_28 + local_24[0] + 1; local_78 = local_78 + 1) {
      std::
      vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
      ::operator[](&local_50,(long)local_78);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::clear
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)0x2806a7);
      if (local_6c == local_78) {
        std::
        vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
        ::operator[](&local_50,(long)local_78);
        Vector2f::Vector2f(&local_80,1.0);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::push_back
                  (in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
      }
    }
    std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
              ((vector<Vector2f,_std::allocator<Vector2f>_> *)0x28076c);
    for (local_9c = 1; local_9c <= local_24[0]; local_9c = local_9c + 1) {
      if (local_9c == local_24[0]) {
        for (local_a0 = 0; local_a0 < (local_28 + local_24[0] + 1) - local_9c;
            local_a0 = local_a0 + 1) {
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          std::
          vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
          ::operator[](&local_50,(long)local_a0);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_a0 + local_9c);
          in_stack_fffffffffffffbf8 =
               (vector<Vector2f,_std::allocator<Vector2f>_> *)
               Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_a0);
          poly_mul<Vector2f>(in_stack_fffffffffffffb98,(double)in_stack_fffffffffffffb90);
          std::
          vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
          ::operator[](&local_50,(long)(local_a0 + 1));
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          in_stack_fffffffffffffbf0 =
               (vector<Vector2f,_std::allocator<Vector2f>_> *)
               Rotate_BSpline::anon_class_16_2_94731ba6::operator()
                         (&local_38,local_a0 + 1 + local_9c);
          Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_a0 + 1);
          poly_mul<Vector2f>(in_stack_fffffffffffffb98,(double)in_stack_fffffffffffffb90);
          poly_minus<Vector2f>(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::operator[](in_RDX,(long)local_a0);
          operator*(in_stack_fffffffffffffb78,(float)((ulong)in_stack_fffffffffffffb70 >> 0x20));
          poly_mul<Vector2f>(in_stack_fffffffffffffba8,
                             (Vector2f *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          poly_add<Vector2f>(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::operator=
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70,
                     in_stack_fffffffffffffb68);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                    ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        }
      }
      for (local_16c = 0; local_16c < (local_28 + local_24[0] + 1) - local_9c;
          local_16c = local_16c + 1) {
        std::
        vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
        ::operator[](&local_50,(long)local_16c);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        dVar3 = Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_16c);
        x_00 = (float)-dVar3;
        a = (vector<Vector2f,_std::allocator<Vector2f>_> *)
            Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_16c);
        Vector2f::Vector2f(&local_208,x_00,(float)-(double)a);
        Vector2f::Vector2f(&local_200,1.0,1.0);
        local_1f8 = &local_208;
        local_1f0 = 2;
        std::allocator<Vector2f>::allocator((allocator<Vector2f> *)0x280cad);
        __l._M_len._0_4_ = in_stack_fffffffffffffba0;
        __l._M_array = (iterator)in_stack_fffffffffffffb98;
        __l._M_len._4_4_ = in_stack_fffffffffffffba4;
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb90,__l,
                   in_stack_fffffffffffffb88);
        Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_16c + local_9c);
        in_stack_fffffffffffffbb8 =
             (anon_class_1_0_00000001 *)
             Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_16c);
        poly_mul<Vector2f>(in_stack_fffffffffffffb98,(double)in_stack_fffffffffffffb90);
        poly_mul<Vector2f>(a,(vector<Vector2f,_std::allocator<Vector2f>_> *)
                             CONCAT44(x_00,in_stack_fffffffffffffbd0));
        std::
        vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
        ::operator[](&local_50,(long)(local_16c + 1));
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbb0 =
             (vector<Vector2f,_std::allocator<Vector2f>_> *)
             Rotate_BSpline::anon_class_16_2_94731ba6::operator()
                       (&local_38,local_16c + 1 + local_9c);
        in_stack_fffffffffffffba4 = (float)(double)in_stack_fffffffffffffbb0;
        in_stack_fffffffffffffba8 =
             (vector<Vector2f,_std::allocator<Vector2f>_> *)
             Rotate_BSpline::anon_class_16_2_94731ba6::operator()
                       (&local_38,local_16c + 1 + local_9c);
        Vector2f::Vector2f((Vector2f *)(local_291 + 1),in_stack_fffffffffffffba4,
                           (float)(double)in_stack_fffffffffffffba8);
        Vector2f::Vector2f((Vector2f *)(local_291 + 9),-1.0,-1.0);
        local_291._17_8_ = local_291 + 1;
        local_278 = 2;
        in_stack_fffffffffffffb98 = (vector<Vector2f,_std::allocator<Vector2f>_> *)local_291;
        std::allocator<Vector2f>::allocator((allocator<Vector2f> *)0x280e5d);
        __l_00._M_len._0_4_ = in_stack_fffffffffffffba0;
        __l_00._M_array = (iterator)in_stack_fffffffffffffb98;
        __l_00._M_len._4_4_ = in_stack_fffffffffffffba4;
        std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb90,__l_00,
                   in_stack_fffffffffffffb88);
        in_stack_fffffffffffffb90 =
             (Rotate_BSpline_Segment *)
             Rotate_BSpline::anon_class_16_2_94731ba6::operator()
                       (&local_38,local_16c + 1 + local_9c);
        in_stack_fffffffffffffb88 =
             (allocator_type *)
             Rotate_BSpline::anon_class_16_2_94731ba6::operator()(&local_38,local_16c + 1);
        poly_mul<Vector2f>(in_stack_fffffffffffffb98,(double)in_stack_fffffffffffffb90);
        poly_mul<Vector2f>(a,(vector<Vector2f,_std::allocator<Vector2f>_> *)
                             CONCAT44(x_00,in_stack_fffffffffffffbd0));
        poly_add<Vector2f>(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        std::
        vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
        ::operator[](&local_50,(long)local_16c);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::operator=
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70,
                   in_stack_fffffffffffffb68);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::allocator<Vector2f>::~allocator((allocator<Vector2f> *)0x280fa1);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
        std::allocator<Vector2f>::~allocator((allocator<Vector2f> *)0x280fe2);
        std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                  ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
      }
    }
    std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
              ((vector<Vector2f,_std::allocator<Vector2f>_> *)0x28119d);
    for (local_2b4 = 0; local_2b4 <= local_28; local_2b4 = local_2b4 + 1) {
      std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::
      vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
      ::operator[](&local_50,(long)local_2b4);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::operator[](in_RDX,(long)local_2b4);
      Vector2f::Vector2f((Vector2f *)in_stack_fffffffffffffb60,(Vector2f *)in_stack_fffffffffffffb58
                        );
      poly_mul<Vector2f>(in_stack_fffffffffffffba8,
                         (Vector2f *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      poly_add<Vector2f>(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::operator=
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffb68);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
      std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
                ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
    }
    pvVar2 = operator_new(0xb0);
    Rotate_BSpline_Segment::Rotate_BSpline_Segment
              (in_stack_fffffffffffffb90,(Material *)in_stack_fffffffffffffb88);
    local_338 = pvVar2;
    local_330 = pvVar2;
    Vector3f::operator=((Vector3f *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    in_stack_fffffffffffffb78 = local_350;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    in_stack_fffffffffffffb70 = local_368;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    poly_neg<double>((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb88);
    in_stack_fffffffffffffb68 = &local_380;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
    Rotate_BSpline::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    in_stack_fffffffffffffb60 = local_3b0;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
    *(double *)((long)local_338 + 0x88) = (double)local_70;
    *(double *)((long)local_338 + 0x90) = (double)local_74;
    std::vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>::push_back
              ((vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *)
               in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
    std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
              ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
    std::vector<Vector2f,_std::allocator<Vector2f>_>::~vector
              ((vector<Vector2f,_std::allocator<Vector2f>_> *)in_stack_fffffffffffffb70);
  }
  local_65 = 1;
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::~vector((vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
             *)in_stack_fffffffffffffb70);
  return in_RDI;
}

Assistant:

std::vector<Rotate_BSpline_Segment*> Rotate_BSpline(Vector3f o, std::vector<Vector2f> controls, Material* m, int K=3) {
//	cout << o[0] << ',' << o[1] << "," << o[2] << " | " << controls.size() << "  |  " << m<<" " << K << "?\n";
//	for (auto t : controls) cout << t[0] << "," << t[1] << " "; cout << "?\n";
	using std::vector;
	int N = int(controls.size()) - 1;
	auto tt = [&](int w) {return w * 1.0 / (N + K + 1); };
	vector<vector<Vector2f>> f(N + K + 1);
	std::vector<Rotate_BSpline_Segment*> output;
	for (int g = K; g <= N; ++g) {
		float l = tt(g), r = tt(g + 1);
		for (int j = 0; j < N + K + 1; ++j)
		{
			f[j].clear();
			if (g == j) f[j].push_back(1);
		}
		vector<Vector2f> t;
		for (int x = 1; x <= K; ++x)
		{
			if (x == K)
			{
				for (int j = 0; j < N + K + 1 - x; ++j)
					t = poly_add(t, poly_mul(poly_minus(
						poly_mul(f[j], 1.0 / (tt(j + x) - tt(j))), 
						poly_mul(f[j + 1], 1.0 / (tt(j + x + 1) - tt(j + 1)))), 
						controls[j] * x));
			}
			for (int j = 0; j < N + K + 1 - x; ++j)
				f[j] = poly_add(poly_mul(f[j], poly_mul(
					std::vector<Vector2f>{ Vector2f(-tt(j),-tt(j)),Vector2f(1,1) }, 1.0 / (tt(j + x) - tt(j)))),
				poly_mul(f[j + 1], poly_mul(std::vector<Vector2f>{ 
					Vector2f(tt(j + x + 1), tt(j + x + 1)),Vector2f(-1,-1) }, 1.0 / (tt(j + x + 1) - tt(j + 1)))));
//				f[j] = (g - tt(j)) / (tt(j + x) - tt(j)) * f[j] + (tt(j + x + 1) - g) / (tt(j + x + 1) - tt(j + 1)) * f[j + 1];
		}
		vector<Vector2f> v;
		for (int j = 0; j <= N; ++j)
			v = poly_add(v, poly_mul(f[j], controls[j]));
		auto gx = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[0]);
			return s;
		};
		auto gy = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[1]);
			return s;
		};
		Rotate_BSpline_Segment *s_p=new Rotate_BSpline_Segment(m),&s=*s_p;
		s.o = o; s.px = gx(v); s.py = gy(v);
		s.nx = poly_neg(gy(t)); s.ny = gx(t);
		s.l = l; s.r = r; output.push_back(s_p);
	}
//	cerr << K << "," << N << " " << output.size() << "?\n";
	return output;
}